

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void google::protobuf::internal::ExtensionSet::RegisterExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed)

{
  LogMessage *pLVar1;
  undefined1 local_110 [8];
  ExtensionInfo info;
  LogMessage local_e0;
  LogFinisher local_a2;
  byte local_a1;
  LogMessage local_a0;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  byte local_17;
  byte local_16;
  FieldType local_15;
  int local_14;
  bool is_packed_local;
  bool is_repeated_local;
  FieldType type_local;
  MessageLite *pMStack_10;
  int number_local;
  MessageLite *extendee_local;
  
  local_51 = 0;
  local_17 = is_packed;
  local_16 = is_repeated;
  local_15 = type;
  local_14 = number;
  pMStack_10 = extendee;
  if (type == '\x0e') {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x9c);
    local_51 = 1;
    pLVar1 = LogMessage::operator<<
                       (&local_50,"CHECK failed: (type) != (WireFormatLite::TYPE_ENUM): ");
    LogFinisher::operator=(local_65,pLVar1);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage(&local_50);
  }
  local_a1 = 0;
  if (local_15 == '\v') {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x9d);
    local_a1 = 1;
    pLVar1 = LogMessage::operator<<
                       (&local_a0,"CHECK failed: (type) != (WireFormatLite::TYPE_MESSAGE): ");
    LogFinisher::operator=(&local_a2,pLVar1);
  }
  if ((local_a1 & 1) != 0) {
    LogMessage::~LogMessage(&local_a0);
  }
  info.descriptor._7_1_ = 0;
  if (local_15 == '\n') {
    LogMessage::LogMessage
              (&local_e0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x9e);
    info.descriptor._7_1_ = 1;
    pLVar1 = LogMessage::operator<<
                       (&local_e0,"CHECK failed: (type) != (WireFormatLite::TYPE_GROUP): ");
    LogFinisher::operator=((LogFinisher *)((long)&info.descriptor + 6),pLVar1);
  }
  if ((info.descriptor._7_1_ & 1) != 0) {
    LogMessage::~LogMessage(&local_e0);
  }
  ExtensionInfo::ExtensionInfo
            ((ExtensionInfo *)local_110,pMStack_10,local_14,local_15,(bool)(local_16 & 1),
             (bool)(local_17 & 1));
  anon_unknown_22::Register((ExtensionInfo *)local_110);
  return;
}

Assistant:

void ExtensionSet::RegisterExtension(const MessageLite* extendee, int number,
                                     FieldType type, bool is_repeated,
                                     bool is_packed) {
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_ENUM);
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_MESSAGE);
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed);
  Register(info);
}